

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

Value * __thiscall
GlobOpt::NewFixedFunctionValue(GlobOpt *this,JavascriptFunction *function,AddrOpnd *addrOpnd)

{
  Var *key;
  undefined2 type;
  Sym *sym;
  Var pvVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Value *pVVar5;
  VarConstantValueInfo *pVVar6;
  ValueInfo *pVVar7;
  Value *local_40;
  Value *local_38;
  Value *cachedValue;
  
  if (function == (JavascriptFunction *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x11e8,"(function != nullptr)","function != nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  local_38 = (Value *)0x0;
  key = &addrOpnd->m_address;
  bVar3 = JsUtil::
          BaseDictionary<void*,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetValue<void*>
                    ((BaseDictionary<void*,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this->addrConstantToValueMap,key,&local_38);
  if ((((bVar3) && (sym = local_38->valueInfo->symStore, sym != (Sym *)0x0)) &&
      (bVar3 = GlobOptBlockData::IsLive(&this->currentBlock->globOptData,sym), bVar3)) &&
     ((pVVar5 = GlobOptBlockData::FindValue(&this->currentBlock->globOptData,sym),
      pVVar5 != (Value *)0x0 && (pVVar5->valueNumber == local_38->valueNumber)))) {
    pVVar7 = pVVar5->valueInfo;
    bVar3 = ValueInfo::IsVarConstant(pVVar7);
    if ((bVar3) &&
       ((pVVar6 = ValueInfo::AsVarConstant(pVVar7), pVVar6->varValue == *key &&
        (local_40 = pVVar5, pVVar6->isFunction == true)))) goto LAB_0044fd81;
  }
  pvVar1 = addrOpnd->m_localAddress;
  type = (addrOpnd->super_Opnd).m_valueType;
  pVVar7 = (ValueInfo *)new<Memory::JitArenaAllocator>(0x30,this->alloc,0x3eba5c);
  ValueInfo::ValueInfo(pVVar7,(ValueType)type,VarConstant);
  pVVar7->_vptr_ValueInfo = (_func_int **)&PTR_AddVtable_014d5398;
  pVVar7[1]._vptr_ValueInfo = (_func_int **)function;
  *(Var *)&pVVar7[1].super_ValueType = pvVar1;
  *(undefined1 *)&pVVar7[1].symStore = 1;
  local_40 = NewValue(this,pVVar7);
  JsUtil::
  BaseDictionary<void*,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  ::
  Insert<(JsUtil::BaseDictionary<void*,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
            ((BaseDictionary<void*,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              *)this->addrConstantToValueMap,key,&local_40);
LAB_0044fd81:
  GlobOptBlockData::InsertNewValue(&this->currentBlock->globOptData,local_40,&addrOpnd->super_Opnd);
  return local_40;
}

Assistant:

Value *
GlobOpt::NewFixedFunctionValue(Js::JavascriptFunction *function, IR::AddrOpnd *addrOpnd)
{
    Assert(function != nullptr);

    Value *val = nullptr;
    Value *cachedValue = nullptr;
    if(this->addrConstantToValueMap->TryGetValue(addrOpnd->m_address, &cachedValue))
    {
        // The cached value could be from a different block since this is a global (as opposed to a per-block) cache. Since
        // values are cloned for each block, we can't use the same value object. We also can't have two values with the same
        // number in one block, so we can't simply copy the cached value either. And finally, there is no deterministic and fast
        // way to determine if a value with the same value number exists for this block. So the best we can do with a global
        // cache is to check the sym-store's value in the current block to see if it has a value with the same number.
        // Otherwise, we have to create a new value with a new value number.
        Sym *symStore = cachedValue->GetValueInfo()->GetSymStore();
        if(symStore && CurrentBlockData()->IsLive(symStore))
        {
            Value *const symStoreValue = CurrentBlockData()->FindValue(symStore);
            if(symStoreValue && symStoreValue->GetValueNumber() == cachedValue->GetValueNumber())
            {
                ValueInfo *const symStoreValueInfo = symStoreValue->GetValueInfo();
                if(symStoreValueInfo->IsVarConstant())
                {
                    VarConstantValueInfo *const symStoreVarConstantValueInfo = symStoreValueInfo->AsVarConstant();
                    if(symStoreVarConstantValueInfo->VarValue() == addrOpnd->m_address &&
                        symStoreVarConstantValueInfo->IsFunction())
                    {
                        val = symStoreValue;
                    }
                }
            }
        }
    }

    if(!val)
    {
        VarConstantValueInfo *valueInfo = VarConstantValueInfo::New(this->alloc, function, addrOpnd->GetValueType(), true, addrOpnd->m_localAddress);
        val = NewValue(valueInfo);
        this->addrConstantToValueMap->AddNew(addrOpnd->m_address, val);
    }

    CurrentBlockData()->InsertNewValue(val, addrOpnd);
    return val;
}